

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O2

void __thiscall
tchecker::
intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::
intrusive_shared_ptr_t
          (intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
           *this,intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
                 *p)

{
  this->_t = (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0;
  reset(this,p->_t);
  reset(p,(make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0);
  return;
}

Assistant:

intrusive_shared_ptr_t(tchecker::intrusive_shared_ptr_t<T> && p) : _t(nullptr)
  {
    reset(p._t);
    p.reset(nullptr);
  }